

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

void Gia_ManFromIfGetConfig(Vec_Int_t *vConfigs,If_Man_t *pIfMan,If_Cut_t *pCutBest,int fCompl)

{
  If_DsdMan_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  word *pwVar8;
  char *pcVar9;
  word *p_00;
  If_Obj_t *pIVar10;
  int nIntNum;
  int nPermBitOne;
  int nPermBitNum;
  int nTtBitNum;
  int nVarNum;
  int Var;
  int Lit;
  int i;
  int v;
  word *pArray;
  char *pCutPerm;
  word *pPerm;
  If_Obj_t *pIfObj;
  int fCompl_local;
  If_Cut_t *pCutBest_local;
  If_Man_t *pIfMan_local;
  Vec_Int_t *vConfigs_local;
  
  p = pIfMan->pIfDsdMan;
  iVar1 = If_CutDsdLit(pIfMan,pCutBest);
  pwVar8 = If_DsdManGetFuncConfig(p,iVar1);
  pcVar9 = If_CutDsdPerm(pIfMan,pCutBest);
  iVar1 = If_DsdManVarNum(pIfMan->pIfDsdMan);
  iVar2 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
  iVar3 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
  iVar4 = Vec_IntEntry(vConfigs,1);
  for (Var = 0; Var < iVar4; Var = Var + 1) {
    Vec_IntPush(vConfigs,0);
  }
  iVar5 = Vec_IntSize(vConfigs);
  p_00 = (word *)Vec_IntEntryP(vConfigs,iVar5 - iVar4);
  if (iVar3 % iVar1 == 0) {
    for (Var = 0; Var < iVar2; Var = Var + 1) {
      iVar5 = Abc_TtGetBit(pwVar8 + 1,Var);
      if (iVar5 != 0) {
        Abc_TtSetBit(p_00,Var);
      }
    }
    Lit = 0;
    while( true ) {
      if (iVar1 <= Lit) {
        if (iVar2 + iVar3 < iVar4 * 0x20) {
          iVar1 = If_CutDsdLit(pIfMan,pCutBest);
          uVar6 = Abc_LitIsCompl(iVar1);
          if ((uVar6 ^ *(uint *)&pCutBest->field_0x1c >> 0xc & 1) != fCompl) {
            Abc_TtSetBit(p_00,iVar2 + iVar3);
          }
          Vec_IntAddToEntry(vConfigs,0,1);
          return;
        }
        __assert_fail("nTtBitNum + nPermBitNum < 32 * nIntNum",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x60b,"void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)"
                     );
      }
      uVar6 = (uint)(*pwVar8 >> ((byte)(Lit << 2) & 0x3f)) & 0xf;
      if (*(uint *)&pCutBest->field_0x1c >> 0x18 <= uVar6) break;
      iVar5 = (int)pcVar9[(int)uVar6];
      iVar7 = Abc_Lit2Var(iVar5);
      if ((int)(*(uint *)&pCutBest->field_0x1c >> 0x18) <= iVar7) {
        __assert_fail("Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x601,"void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)"
                     );
      }
      iVar7 = Abc_Lit2Var(iVar5);
      pIVar10 = If_ManObj(pIfMan,(int)(&pCutBest[1].Area)[iVar7]);
      iVar7 = Abc_LitIsCompl((pIVar10->field_22).iCopy);
      iVar5 = Abc_LitNotCond(iVar5,iVar7);
      for (Var = 0; Var < iVar3 / iVar1; Var = Var + 1) {
        if ((iVar5 >> ((byte)Var & 0x1f) & 1U) != 0) {
          Abc_TtSetBit(p_00,iVar2 + Lit * (iVar3 / iVar1) + Var);
        }
      }
      Lit = Lit + 1;
    }
    __assert_fail("Var < (int)pCutBest->nLeaves",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x5fe,"void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)");
  }
  __assert_fail("nPermBitNum % nVarNum == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                ,0x5f4,"void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)");
}

Assistant:

void Gia_ManFromIfGetConfig( Vec_Int_t * vConfigs, If_Man_t * pIfMan, If_Cut_t * pCutBest, int fCompl )
{
    If_Obj_t * pIfObj;
    word * pPerm = If_DsdManGetFuncConfig( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest) ); // cell input -> DSD input
    char * pCutPerm = If_CutDsdPerm( pIfMan, pCutBest ); // DSD input -> cut input
    word * pArray;  int v, i, Lit, Var;
    int nVarNum = If_DsdManVarNum(pIfMan->pIfDsdMan);
    int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    int nPermBitOne = nPermBitNum / nVarNum;
    // prepare storage
    int nIntNum = Vec_IntEntry( vConfigs, 1 );
    for ( i = 0; i < nIntNum; i++ )
        Vec_IntPush( vConfigs, 0 );
    pArray = (word *)Vec_IntEntryP( vConfigs, Vec_IntSize(vConfigs) - nIntNum );
    assert( nPermBitNum % nVarNum == 0 );
    // set truth table bits
    for ( i = 0; i < nTtBitNum; i++ )
        if ( Abc_TtGetBit(pPerm + 1, i) )
            Abc_TtSetBit( pArray, i );
    // set permutation bits
    for ( v = 0; v < nVarNum; v++ )
    {
        // get DSD variable
        Var = ((pPerm[0] >> (v * 4)) & 0xF);
        assert( Var < (int)pCutBest->nLeaves );
        // get AIG literal
        Lit = (int)pCutPerm[Var];
        assert( Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves );
        // complement if polarity has changed
        pIfObj = If_ManObj( pIfMan, pCutBest->pLeaves[Abc_Lit2Var(Lit)] );
        Lit = Abc_LitNotCond( Lit, Abc_LitIsCompl(pIfObj->iCopy) );
        // create config literal
        for ( i = 0; i < nPermBitOne; i++ )
            if ( (Lit >> i) & 1 )
                Abc_TtSetBit( pArray, nTtBitNum + v * nPermBitOne + i );
    }
    // remember complementation
    assert( nTtBitNum + nPermBitNum < 32 * nIntNum );
    if ( Abc_LitIsCompl(If_CutDsdLit(pIfMan, pCutBest)) ^ pCutBest->fCompl ^ fCompl )
        Abc_TtSetBit( pArray, nTtBitNum + nPermBitNum );
    // update count
    Vec_IntAddToEntry( vConfigs, 0, 1 );
}